

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
BoundedAddBind(ClientContext *context,ScalarFunction *bound_function,
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *arguments)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this;
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  int32_t iVar4;
  int32_t iVar5;
  reference pvVar6;
  pointer pEVar7;
  reference pvVar8;
  BinderException *this_00;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 auStack_60 [2];
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_50;
  LogicalType local_48 [24];
  
  this = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *)CONCAT71(in_register_00000009,in_CL);
  BoundedType::GetDefault();
  pvVar6 = duckdb::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this,0);
  pEVar7 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->(pvVar6);
  cVar3 = duckdb::LogicalType::operator==((LogicalType *)&local_70,(LogicalType *)(pEVar7 + 0x38));
  if (cVar3 == '\0') {
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_70);
  }
  else {
    BoundedType::GetDefault();
    pvVar6 = duckdb::
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](this,1);
    pEVar7 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    cVar3 = duckdb::LogicalType::operator==(local_48,(LogicalType *)(pEVar7 + 0x38));
    local_50._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
         (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)context;
    duckdb::LogicalType::~LogicalType(local_48);
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_70);
    if (cVar3 != '\0') {
      pvVar6 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this,0);
      pEVar7 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar6);
      iVar4 = BoundedType::GetMaxValue((LogicalType *)(pEVar7 + 0x38));
      pvVar6 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this,1);
      pEVar7 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar6);
      iVar5 = BoundedType::GetMaxValue((LogicalType *)(pEVar7 + 0x38));
      pvVar6 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this,0);
      pEVar7 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar6);
      pvVar8 = duckdb::vector<duckdb::LogicalType,_true>::operator[]
                         ((vector<duckdb::LogicalType,_true> *)(arguments + 0x48),0);
      if (pvVar8 != (reference)(pEVar7 + 0x38)) {
        *pvVar8 = (value_type)pEVar7[0x38];
        *(Expression *)(pvVar8 + 1) = pEVar7[0x39];
        duckdb::shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar8 + 8),
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar7 + 0x40));
      }
      pvVar6 = duckdb::
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](this,1);
      pEVar7 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
               ::operator->(pvVar6);
      pvVar8 = duckdb::vector<duckdb::LogicalType,_true>::operator[]
                         ((vector<duckdb::LogicalType,_true> *)(arguments + 0x48),1);
      if (pvVar8 != (reference)(pEVar7 + 0x38)) {
        *pvVar8 = (value_type)pEVar7[0x38];
        *(Expression *)(pvVar8 + 1) = pEVar7[0x39];
        duckdb::shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar8 + 8),
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar7 + 0x40));
      }
      BoundedType::Get((BoundedType *)&local_70,iVar5 + iVar4);
      arguments[0x90] = local_70._0_1_;
      arguments[0x91] = local_70._1_1_;
      uVar1 = *(undefined8 *)(arguments + 0x98);
      uVar2 = *(undefined8 *)(arguments + 0xa0);
      *(undefined8 *)(arguments + 0x98) = local_68;
      *(undefined8 *)(arguments + 0xa0) = auStack_60[0];
      local_68 = uVar1;
      auStack_60[0] = uVar2;
      duckdb::LogicalType::~LogicalType((LogicalType *)&local_70);
      *(undefined8 *)
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = 0;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
             local_50._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_70 = auStack_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"bounded_add expects two BOUNDED types","");
  duckdb::BinderException::BinderException(this_00,(string *)&local_70);
  __cxa_throw(this_00,&duckdb::BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> BoundedAddBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	if (BoundedType::GetDefault() == arguments[0]->return_type &&
	    BoundedType::GetDefault() == arguments[1]->return_type) {
		auto left_max_val = BoundedType::GetMaxValue(arguments[0]->return_type);
		auto right_max_val = BoundedType::GetMaxValue(arguments[1]->return_type);

		auto new_max_val = left_max_val + right_max_val;
		bound_function.arguments[0] = arguments[0]->return_type;
		bound_function.arguments[1] = arguments[1]->return_type;
		bound_function.return_type = BoundedType::Get(new_max_val);
	} else {
		throw BinderException("bounded_add expects two BOUNDED types");
	}
	return nullptr;
}